

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

bool __thiscall QListModel::removeRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QListWidgetItem *pQVar4;
  ulong i;
  int r;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    iVar1 = count + row;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    iVar3 = (**(code **)(*(long *)this + 0x78))();
    if ((iVar1 <= iVar3) &&
       (((parent->r < 0 || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_48 = 0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_48,row);
      if (0 < count) {
        i = (ulong)(uint)row;
        do {
          pQVar4 = QList<QListWidgetItem_*>::takeAt(&this->items,i);
          pQVar4->view = (QListWidget *)0x0;
          pQVar4->d->theid = -1;
          if (pQVar4 != (QListWidgetItem *)0x0) {
            (*pQVar4->_vptr_QListWidgetItem[1])(pQVar4);
          }
          row = row + 1;
        } while (row < iVar1);
      }
      QAbstractItemModel::endRemoveRows();
      bVar2 = true;
      goto LAB_0058606c;
    }
  }
  bVar2 = false;
LAB_0058606c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::removeRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || (row + count) > rowCount() || parent.isValid())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    QListWidgetItem *itm = nullptr;
    for (int r = row; r < row + count; ++r) {
        itm = items.takeAt(row);
        itm->view = nullptr;
        itm->d->theid = -1;
        delete itm;
    }
    endRemoveRows();
    return true;
}